

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O1

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::initParameters
          (FastAndEffectiveFeaturePreservingMeshDenoising *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParameterSet *pPVar2;
  string local_40;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Face Neighbor","");
  ParameterSet::addParameter(pPVar2,&local_40,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Threshold T","");
  ParameterSet::addParameter(pPVar2,&local_40,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Normal Iteration Num.","");
  ParameterSet::addParameter(pPVar2,&local_40,0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Vertex Iteration Num.","");
  ParameterSet::addParameter(pPVar2,&local_40,0x32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("Face Neighbor"), 0);

    parameter_set_->addParameter(string("Threshold T"), 0.5);

    parameter_set_->addParameter(string("Normal Iteration Num."), 20);

    parameter_set_->addParameter(string("Vertex Iteration Num."), 50);

}